

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.h
# Opt level: O2

ForeignMessageLite * __thiscall
proto2_unittest::TestAllTypesLite::_internal_mutable_optional_foreign_message
          (TestAllTypesLite *this)

{
  ForeignMessageLite *pFVar1;
  Arena *arena;
  
  pFVar1 = (this->field_0)._impl_.optional_foreign_message_;
  if (pFVar1 != (ForeignMessageLite *)0x0) {
    return pFVar1;
  }
  arena = (Arena *)(this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pFVar1 = (ForeignMessageLite *)
           google::protobuf::Arena::DefaultConstruct<proto2_unittest::ForeignMessageLite>(arena);
  (this->field_0)._impl_.optional_foreign_message_ = pFVar1;
  return pFVar1;
}

Assistant:

TestAllTypesLite::_internal_mutable_optional_foreign_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.optional_foreign_message_ == nullptr) {
    auto* p = ::google::protobuf::MessageLite::DefaultConstruct<::proto2_unittest::ForeignMessageLite>(GetArena());
    _impl_.optional_foreign_message_ = reinterpret_cast<::proto2_unittest::ForeignMessageLite*>(p);
  }
  return _impl_.optional_foreign_message_;
}